

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TraceStats_BufferStats::ParseFromArray
          (TraceStats_BufferStats *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  uint8_t cur_byte_3;
  ulong uVar9;
  uint8_t cur_byte_2;
  ulong *puVar10;
  uint8_t cur_byte;
  ulong uVar11;
  uint8_t cur_byte_1;
  ulong *puVar12;
  Field local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  do {
    if (puVar8 <= raw) goto switchD_0022c549_caseD_3;
    bVar1 = (byte)*raw;
    uVar7 = (ulong)bVar1;
    puVar10 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar7 = (ulong)(bVar1 & 0x7f);
      lVar5 = 7;
      do {
        if ((puVar8 <= puVar10) || (0x38 < lVar5 - 7U)) goto switchD_0022c549_caseD_3;
        uVar4 = *puVar10;
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar7 = uVar7 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
        lVar5 = lVar5 + 7;
      } while ((char)(byte)uVar4 < '\0');
    }
    uVar4 = uVar7 >> 3;
    if (((uint)uVar4 == 0) || (puVar8 <= puVar10)) goto switchD_0022c549_caseD_3;
    switch((uint)uVar7 & 7) {
    case 0:
      uVar6 = 0;
      uVar9 = 0;
      while( true ) {
        puVar12 = (ulong *)((long)puVar10 + 1);
        uVar6 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar6;
        if (-1 < (char)(byte)*puVar10) break;
        if ((puVar8 <= puVar12) ||
           (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar10 = puVar12, bVar2))
        goto switchD_0022c549_caseD_3;
      }
      uVar9 = uVar6 & 0xffffffff00000000;
      break;
    case 1:
      puVar12 = puVar10 + 1;
      if (puVar8 < puVar12) goto switchD_0022c549_caseD_3;
      uVar6 = *puVar10;
      uVar9 = uVar6 & 0xffffffff00000000;
      break;
    case 2:
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar11 = 0;
      uVar6 = 0;
      puVar12 = puVar10;
      while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar6 & 0x3f) | uVar11
            , (char)*(byte *)((long)puVar12 + -1) < '\0') {
        if (puVar8 <= puVar12) goto switchD_0022c549_caseD_3;
        puVar12 = (ulong *)((long)puVar12 + 1);
        puVar10 = (ulong *)((long)puVar10 + 1);
        bVar2 = 0x38 < uVar6;
        uVar6 = uVar6 + 7;
        if (bVar2) goto switchD_0022c549_caseD_3;
      }
      if (uVar11 <= (ulong)((long)puVar8 - (long)puVar10)) {
        uVar9 = (ulong)puVar10 & 0xffffffff00000000;
        puVar12 = (ulong *)((long)puVar12 + uVar11);
        uVar6 = (ulong)puVar10 & 0xffffffff;
        goto LAB_0022c626;
      }
    default:
      goto switchD_0022c549_caseD_3;
    case 5:
      puVar12 = (ulong *)((long)puVar10 + 4);
      if (puVar8 < puVar12) goto switchD_0022c549_caseD_3;
      uVar6 = (ulong)(uint)*puVar10;
      uVar9 = 0;
    }
    uVar11 = 0;
LAB_0022c626:
    raw = puVar12;
  } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar11));
  local_48.int_value_ = uVar9 | uVar6 & 0xffffffff;
  uVar6 = uVar4 << 0x20 | uVar11;
  local_48.type_ = (byte)(uVar6 >> 0x30) | (byte)uVar7 & 7;
  local_48.size_ = (uint32_t)uVar11;
  local_48.id_ = (uint16_t)(uVar6 >> 0x20);
  sVar3 = (short)uVar4;
  while (sVar3 != 0) {
    if ((ushort)uVar4 < 0x14) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar4 & 0x3f);
    }
    switch((uint)uVar4 & 0xffff) {
    case 1:
      this->bytes_written_ = local_48.int_value_;
      break;
    case 2:
      this->chunks_written_ = local_48.int_value_;
      break;
    case 3:
      this->chunks_overwritten_ = local_48.int_value_;
      break;
    case 4:
      this->write_wrap_count_ = local_48.int_value_;
      break;
    case 5:
      this->patches_succeeded_ = local_48.int_value_;
      break;
    case 6:
      this->patches_failed_ = local_48.int_value_;
      break;
    case 7:
      this->readaheads_succeeded_ = local_48.int_value_;
      break;
    case 8:
      this->readaheads_failed_ = local_48.int_value_;
      break;
    case 9:
      this->abi_violations_ = local_48.int_value_;
      break;
    case 10:
      this->chunks_rewritten_ = local_48.int_value_;
      break;
    case 0xb:
      this->chunks_committed_out_of_order_ = local_48.int_value_;
      break;
    case 0xc:
      this->buffer_size_ = local_48.int_value_;
      break;
    case 0xd:
      this->bytes_overwritten_ = local_48.int_value_;
      break;
    case 0xe:
      this->bytes_read_ = local_48.int_value_;
      break;
    case 0xf:
      this->padding_bytes_written_ = local_48.int_value_;
      break;
    case 0x10:
      this->padding_bytes_cleared_ = local_48.int_value_;
      break;
    case 0x11:
      this->chunks_read_ = local_48.int_value_;
      break;
    case 0x12:
      this->chunks_discarded_ = local_48.int_value_;
      break;
    case 0x13:
      this->trace_writer_packet_loss_ = local_48.int_value_;
      break;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_48,local_38);
    }
    do {
      if (puVar8 <= raw) goto switchD_0022c549_caseD_3;
      bVar1 = (byte)*raw;
      uVar7 = (ulong)(uint)bVar1;
      puVar10 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar5 = 7;
        do {
          if ((puVar8 <= puVar10) || (0x38 < lVar5 - 7U)) goto switchD_0022c549_caseD_3;
          uVar4 = *puVar10;
          puVar10 = (ulong *)((long)puVar10 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
          lVar5 = lVar5 + 7;
        } while ((char)(byte)uVar4 < '\0');
      }
      uVar4 = uVar7 >> 3;
      if (((uint)uVar4 == 0) || (puVar8 <= puVar10)) goto switchD_0022c549_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar6 = 0;
        uVar9 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar10 + 1);
          uVar6 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar6;
          if (-1 < (char)(byte)*puVar10) break;
          if ((puVar8 <= puVar12) ||
             (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar10 = puVar12, bVar2))
          goto switchD_0022c549_caseD_3;
        }
        uVar9 = uVar6 & 0xffffffff00000000;
        break;
      case 1:
        puVar12 = puVar10 + 1;
        if (puVar8 < puVar12) goto switchD_0022c549_caseD_3;
        uVar6 = *puVar10;
        uVar9 = uVar6 & 0xffffffff00000000;
        break;
      case 2:
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar11 = 0;
        uVar6 = 0;
        puVar12 = puVar10;
        while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar6 & 0x3f) |
                        uVar11, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar8 <= puVar12) goto switchD_0022c549_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar10 = (ulong *)((long)puVar10 + 1);
          bVar2 = 0x38 < uVar6;
          uVar6 = uVar6 + 7;
          if (bVar2) goto switchD_0022c549_caseD_3;
        }
        if (uVar11 <= (ulong)((long)puVar8 - (long)puVar10)) {
          uVar9 = (ulong)puVar10 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar11);
          uVar6 = (ulong)puVar10 & 0xffffffff;
          goto LAB_0022c996;
        }
      default:
        goto switchD_0022c549_caseD_3;
      case 5:
        puVar12 = (ulong *)((long)puVar10 + 4);
        if (puVar8 < puVar12) goto switchD_0022c549_caseD_3;
        uVar6 = (ulong)(uint)*puVar10;
        uVar9 = 0;
      }
      uVar11 = 0;
LAB_0022c996:
      raw = puVar12;
    } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar11));
    local_48.int_value_ = uVar9 | uVar6 & 0xffffffff;
    uVar6 = uVar4 << 0x20 | uVar11;
    local_48.type_ = (byte)(uVar6 >> 0x30) | (byte)uVar7 & 7;
    local_48.size_ = (uint32_t)uVar11;
    local_48.id_ = (uint16_t)(uVar6 >> 0x20);
    sVar3 = (short)uVar4;
  }
switchD_0022c549_caseD_3:
  return puVar8 == (ulong *)raw;
}

Assistant:

bool TraceStats_BufferStats::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 12 /* buffer_size */:
        field.get(&buffer_size_);
        break;
      case 1 /* bytes_written */:
        field.get(&bytes_written_);
        break;
      case 13 /* bytes_overwritten */:
        field.get(&bytes_overwritten_);
        break;
      case 14 /* bytes_read */:
        field.get(&bytes_read_);
        break;
      case 15 /* padding_bytes_written */:
        field.get(&padding_bytes_written_);
        break;
      case 16 /* padding_bytes_cleared */:
        field.get(&padding_bytes_cleared_);
        break;
      case 2 /* chunks_written */:
        field.get(&chunks_written_);
        break;
      case 10 /* chunks_rewritten */:
        field.get(&chunks_rewritten_);
        break;
      case 3 /* chunks_overwritten */:
        field.get(&chunks_overwritten_);
        break;
      case 18 /* chunks_discarded */:
        field.get(&chunks_discarded_);
        break;
      case 17 /* chunks_read */:
        field.get(&chunks_read_);
        break;
      case 11 /* chunks_committed_out_of_order */:
        field.get(&chunks_committed_out_of_order_);
        break;
      case 4 /* write_wrap_count */:
        field.get(&write_wrap_count_);
        break;
      case 5 /* patches_succeeded */:
        field.get(&patches_succeeded_);
        break;
      case 6 /* patches_failed */:
        field.get(&patches_failed_);
        break;
      case 7 /* readaheads_succeeded */:
        field.get(&readaheads_succeeded_);
        break;
      case 8 /* readaheads_failed */:
        field.get(&readaheads_failed_);
        break;
      case 9 /* abi_violations */:
        field.get(&abi_violations_);
        break;
      case 19 /* trace_writer_packet_loss */:
        field.get(&trace_writer_packet_loss_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}